

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslpresharedkeyauthenticator.cpp
# Opt level: O0

bool __thiscall
QSslPreSharedKeyAuthenticator::isEqual
          (QSslPreSharedKeyAuthenticator *this,QSslPreSharedKeyAuthenticator *other)

{
  bool bVar1;
  QSslPreSharedKeyAuthenticatorPrivate *pQVar2;
  QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar3;
  QByteArray *in_stack_ffffffffffffffb8;
  QByteArray *rhs;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_21;
  bool local_11;
  
  bVar1 = ::operator==((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
  local_11 = true;
  if (!bVar1) {
    QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
              ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39f9d1);
    QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
              ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39f9e4);
    bVar1 = ::operator==((QByteArray *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                         ,in_stack_ffffffffffffffb8);
    local_21 = false;
    if (bVar1) {
      QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39fa11);
      QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39fa24);
      bVar1 = ::operator==((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8);
      local_21 = false;
      if (bVar1) {
        pQVar2 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                           ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39fa51);
        iVar3 = pQVar2->maximumIdentityLength;
        pQVar2 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                           ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39fa62);
        local_21 = false;
        if (iVar3 == pQVar2->maximumIdentityLength) {
          pQVar2 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                             ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39fa7e);
          rhs = &pQVar2->preSharedKey;
          QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                    ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39fa91);
          bVar1 = ::operator==((QByteArray *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),rhs);
          local_21 = false;
          if (bVar1) {
            pQVar2 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                               ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39fabb
                               );
            iVar3 = pQVar2->maximumPreSharedKeyLength;
            pQVar2 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                               ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)0x39facc
                               );
            local_21 = iVar3 == pQVar2->maximumPreSharedKeyLength;
          }
        }
      }
    }
    local_11 = local_21;
  }
  return local_11;
}

Assistant:

bool QSslPreSharedKeyAuthenticator::isEqual(const QSslPreSharedKeyAuthenticator &other) const
{
    return ((d == other.d) ||
            (d->identityHint == other.d->identityHint &&
             d->identity == other.d->identity &&
             d->maximumIdentityLength == other.d->maximumIdentityLength &&
             d->preSharedKey == other.d->preSharedKey &&
             d->maximumPreSharedKeyLength == other.d->maximumPreSharedKeyLength));
}